

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPipelineStatisticsQueryTests.cpp
# Opt level: O0

void __thiscall
glcts::PipelineStatisticsQueryTestFunctionalBase::initQOBO
          (PipelineStatisticsQueryTestFunctionalBase *this)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  GLchar *extraout_RDX;
  GLuint *pGVar4;
  GLdouble *pGVar5;
  GLenum GVar6;
  GLint in_R8D;
  GLint in_R9D;
  GLint in_stack_ffffffffffffe598;
  GLint GVar7;
  GLint in_stack_ffffffffffffe5a8;
  uchar bo_data [32];
  Functions gl;
  PipelineStatisticsQueryTestFunctionalBase *this_local;
  
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  memcpy(bo_data + 0x18,(void *)CONCAT44(extraout_var,iVar1),0x1a28);
  memset(&stack0xffffffffffffe5a8,0xff,0x20);
  pGVar4 = &this->m_bo_qo_id;
  GVar6 = 1;
  (*gl.frontFace)(1);
  dVar2 = (*gl.getDoublev)(GVar6,(GLdouble *)pGVar4);
  glu::checkError(dVar2,"glGenBuffers() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cPipelineStatisticsQueryTests.cpp"
                  ,0x89e);
  pGVar5 = (GLdouble *)(ulong)this->m_bo_qo_id;
  GVar6 = 0x8892;
  (*gl.bindAttribLocation)(0x8892,this->m_bo_qo_id,extraout_RDX);
  GVar7 = (GLint)this;
  dVar2 = (*gl.getDoublev)(GVar6,pGVar5);
  glu::checkError(dVar2,"glBindBuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cPipelineStatisticsQueryTests.cpp"
                  ,0x8a1);
  GVar6 = 0x8892;
  pGVar5 = (GLdouble *)0x20;
  (*gl.blitNamedFramebuffer)
            (0x8892,0x20,(GLint)&stack0xffffffffffffe5a8,0x88e4,in_R8D,in_R9D,
             in_stack_ffffffffffffe598,GVar7,in_stack_ffffffffffffe5a8,bo_data._0_4_,bo_data._8_4_,
             bo_data._16_4_);
  dVar2 = (*gl.getDoublev)(GVar6,pGVar5);
  glu::checkError(dVar2,"glBufferData() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cPipelineStatisticsQueryTests.cpp"
                  ,0x8a4);
  return;
}

Assistant:

void PipelineStatisticsQueryTestFunctionalBase::initQOBO()
{
	const glw::Functions gl = m_context.getRenderContext().getFunctions();

	/* Set up the buffer object we will use for storage of query object results */
	unsigned char bo_data[PipelineStatisticsQueryUtilities::qo_bo_size];

	memset(bo_data, 0xFF, sizeof(bo_data));

	gl.genBuffers(1, &m_bo_qo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() call failed.");

	gl.bindBuffer(GL_ARRAY_BUFFER, m_bo_qo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed.");

	gl.bufferData(GL_ARRAY_BUFFER, PipelineStatisticsQueryUtilities::qo_bo_size, bo_data, GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() call failed.");
}